

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask_sse4.c
# Opt level: O3

void blend_a64_vmask_b10_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,int w,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  undefined1 in_XMM0 [16];
  undefined1 auVar4 [16];
  short sVar5;
  short sVar7;
  undefined1 auVar6 [16];
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  
  lVar3 = 0;
  auVar4 = pmovsxbw(in_XMM0,0x4040404040404040);
  do {
    auVar6 = pshuflw(ZEXT116(mask[lVar3]),ZEXT116(mask[lVar3]),0);
    sVar5 = auVar6._0_2_;
    sVar7 = auVar6._2_2_;
    uVar1 = *(undefined8 *)src0;
    uVar2 = *(undefined8 *)src1;
    uVar8 = pavgw((ushort)((short)uVar1 * sVar5 + (short)uVar2 * (auVar4._0_2_ - sVar5)) >> 5,0);
    uVar9 = pavgw((ushort)((short)((ulong)uVar1 >> 0x10) * sVar7 +
                          (short)((ulong)uVar2 >> 0x10) * (auVar4._2_2_ - sVar7)) >> 5,0);
    uVar10 = pavgw((ushort)((short)((ulong)uVar1 >> 0x20) * sVar5 +
                           (short)((ulong)uVar2 >> 0x20) * (auVar4._4_2_ - sVar5)) >> 5,0);
    uVar11 = pavgw((ushort)((short)((ulong)uVar1 >> 0x30) * sVar7 +
                           (short)((ulong)uVar2 >> 0x30) * (auVar4._6_2_ - sVar7)) >> 5,0);
    pavgw(0,0);
    pavgw(0,0);
    pavgw(0,0);
    pavgw(0,0);
    *(ulong *)dst = CONCAT26(uVar11,CONCAT24(uVar10,CONCAT22(uVar9,uVar8)));
    lVar3 = lVar3 + 1;
    src1 = src1 + src1_stride;
    src0 = src0 + src0_stride;
    dst = dst + dst_stride;
  } while (h != (int)lVar3);
  return;
}

Assistant:

static void blend_a64_vmask_b10_w4_sse4_1(uint16_t *dst, uint32_t dst_stride,
                                          const uint16_t *src0,
                                          uint32_t src0_stride,
                                          const uint16_t *src1,
                                          uint32_t src1_stride,
                                          const uint8_t *mask, int w, int h) {
  (void)w;
  blend_a64_vmask_bn_w4_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                               src1_stride, mask, h, blend_4_b10);
}